

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_bucket_id_mapping.c
# Opt level: O3

dds_bucket_id_mapping * dds_bucket_id_mapping_init(mapping_type type,double alpha)

{
  dds_bucket_id_mapping *pdVar1;
  double dVar2;
  
  pdVar1 = (dds_bucket_id_mapping *)malloc(0x20);
  pdVar1->alpha = alpha;
  dVar2 = (alpha + 1.0) / (1.0 - alpha);
  pdVar1->gamma_value = dVar2;
  dVar2 = log(dVar2);
  pdVar1->log_gamma = dVar2;
  pdVar1->type = type;
  return pdVar1;
}

Assistant:

struct dds_bucket_id_mapping *dds_bucket_id_mapping_init (enum mapping_type type, double alpha) {
    struct dds_bucket_id_mapping *bid_mapping = (struct dds_bucket_id_mapping *)
                                                 malloc(sizeof(struct dds_bucket_id_mapping));
    bid_mapping->alpha = alpha;
    bid_mapping->gamma_value = (1 + alpha) / (1 - alpha);
    bid_mapping->log_gamma = log(bid_mapping->gamma_value);
    bid_mapping->type = type;
    return bid_mapping;
}